

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::api::json::DecodePsbtRequest::ConvertFromStruct
          (DecodePsbtRequest *this,DecodePsbtRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->psbt_);
  std::__cxx11::string::_M_assign((string *)&this->network_);
  this->has_detail_ = data->has_detail;
  this->has_simple_ = data->has_simple;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodePsbtRequest::ConvertFromStruct(
    const DecodePsbtRequestStruct& data) {
  psbt_ = data.psbt;
  network_ = data.network;
  has_detail_ = data.has_detail;
  has_simple_ = data.has_simple;
  ignore_items = data.ignore_items;
}